

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher.h
# Opt level: O0

void __thiscall
cpsm::Matcher<cpsm::NonPathTraits,_cpsm::Utf8StringTraits>::score_basename_greedy
          (Matcher<cpsm::NonPathTraits,_cpsm::Utf8StringTraits> *this)

{
  bool bVar1;
  reference pcVar2;
  unsigned_long *puVar3;
  difference_type dVar4;
  long in_RDI;
  CharCount current_submatch;
  const_iterator query_last;
  Iterator query_it;
  const_iterator item_last;
  Iterator item_it;
  vector<char32_t,_std::allocator<char32_t>_> *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  char32_t cVar5;
  unsigned_long local_30;
  char32_t *local_28;
  __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_> local_20;
  char32_t *local_18;
  __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
  local_10 [2];
  
  local_10[0]._M_current = *(char32_t **)(in_RDI + 0x20);
  local_18 = (char32_t *)
             std::vector<char32_t,_std::allocator<char32_t>_>::cend(in_stack_ffffffffffffffb8);
  local_20._M_current = *(char32_t **)(in_RDI + 0x40);
  local_28 = (char32_t *)
             std::vector<char32_t,_std::allocator<char32_t>_>::cend(in_stack_ffffffffffffffb8);
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
                      *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     (__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
                      *)in_stack_ffffffffffffffb8);
  if ((!bVar1) &&
     (bVar1 = __gnu_cxx::operator==
                        ((__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
                          *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                         (__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
                          *)in_stack_ffffffffffffffb8), !bVar1)) {
    local_30 = 0;
    do {
      pcVar2 = __gnu_cxx::
               __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
               ::operator*(local_10);
      cVar5 = *pcVar2;
      pcVar2 = __gnu_cxx::
               __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
               ::operator*(&local_20);
      if (cVar5 == *pcVar2) {
        __gnu_cxx::
        __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>::
        operator++(&local_20);
        local_30 = local_30 + 1;
        bVar1 = __gnu_cxx::operator==
                          ((__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
                            *)CONCAT44(cVar5,in_stack_ffffffffffffffc0),
                           (__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
                            *)in_stack_ffffffffffffffb8);
        if (bVar1) break;
      }
      else {
        puVar3 = std::max<unsigned_long>((unsigned_long *)(in_RDI + 0x68),&local_30);
        *(unsigned_long *)(in_RDI + 0x68) = *puVar3;
        local_30 = 0;
      }
      __gnu_cxx::
      __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>::
      operator++(local_10);
      bVar1 = __gnu_cxx::operator==
                        ((__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
                          *)CONCAT44(cVar5,in_stack_ffffffffffffffc0),
                         (__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
                          *)in_stack_ffffffffffffffb8);
    } while (!bVar1);
    puVar3 = std::max<unsigned_long>((unsigned_long *)(in_RDI + 0x68),&local_30);
    *(unsigned_long *)(in_RDI + 0x68) = *puVar3;
    dVar4 = __gnu_cxx::operator-
                      ((__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
                        *)CONCAT44(cVar5,in_stack_ffffffffffffffc0),
                       (__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
                        *)in_stack_ffffffffffffffb8);
    *(difference_type *)(in_RDI + 0x90) = dVar4 + -1;
  }
  return;
}

Assistant:

void score_basename_greedy() {
    auto item_it = item_basename_;
    auto const item_last = item_.cend();
    auto query_it = qit_basename_;
    auto const query_last = query_.cend();
    if (item_it == item_last || query_it == query_last) {
      return;
    }

    CharCount current_submatch = 0;

    while (true) {
      if (*item_it == *query_it) {
        ++query_it;
        current_submatch++;
        if (query_it == query_last) {
          break;
        }
      } else {
        basename_longest_submatch_ =
            std::max(basename_longest_submatch_, current_submatch);
        current_submatch = 0;
      }
      ++item_it;
      if (item_it == item_last) {
        break;
      }
    }
    basename_longest_submatch_ =
        std::max(basename_longest_submatch_, current_submatch);
    // -1 here because we broke out upon reaching the last match (`query_it ==
    // query_last`) before incrementing `item_it`.
    unmatched_suffix_len_ = item_last - item_it - 1;
  }